

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ClosureTest_TestPermanentClosureFunction0_Test::
~ClosureTest_TestPermanentClosureFunction0_Test
          (ClosureTest_TestPermanentClosureFunction0_Test *this)

{
  ClosureTest_TestPermanentClosureFunction0_Test *this_local;
  
  ~ClosureTest_TestPermanentClosureFunction0_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(ClosureTest, TestPermanentClosureFunction0) {
  Closure* closure = NewPermanentCallback(&SetA123Function);
  EXPECT_NE(123, a_);
  closure->Run();
  EXPECT_EQ(123, a_);
  a_ = 0;
  closure->Run();
  EXPECT_EQ(123, a_);
  delete closure;
}